

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::GenericTrack::Dump(GenericTrack *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  UTF16String *this_00;
  char *pcVar3;
  UUID *this_01;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  GenericTrack *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,(FILE *)identbuf._120_8_);
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","TrackID",(ulong)this->TrackID);
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","TrackNumber",(ulong)this->TrackNumber);
  bVar2 = optional_property<ASDCP::MXF::UTF16String>::empty(&this->TrackName);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    this_00 = optional_property<ASDCP::MXF::UTF16String>::get(&this->TrackName);
    pcVar3 = UTF16String::EncodeString(this_00,local_98,0x80);
    fprintf((FILE *)uVar1,"  %22s = %s\n","TrackName",pcVar3);
  }
  bVar2 = optional_property<Kumu::UUID>::empty(&this->Sequence);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    this_01 = optional_property<Kumu::UUID>::get(&this->Sequence);
    pcVar3 = Kumu::UUID::EncodeString(this_01,local_98,0x80);
    fprintf((FILE *)uVar1,"  %22s = %s\n","Sequence",pcVar3);
  }
  return;
}

Assistant:

void
GenericTrack::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %d\n",  "TrackID", TrackID);
  fprintf(stream, "  %22s = %d\n",  "TrackNumber", TrackNumber);
  if ( ! TrackName.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "TrackName", TrackName.get().EncodeString(identbuf, IdentBufferLen));
  }
  if ( ! Sequence.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Sequence", Sequence.get().EncodeString(identbuf, IdentBufferLen));
  }
}